

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void sr_x_2tap_32_avx2(uint8_t *src,__m256i *coeffs,uint8_t *dst)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  auVar2 = vpunpcklbw_avx2(*(undefined1 (*) [32])src,*(undefined1 (*) [32])(src + 1));
  auVar1 = vpunpckhbw_avx2(*(undefined1 (*) [32])src,*(undefined1 (*) [32])(src + 1));
  auVar2 = vpmaddubsw_avx2(auVar2,(undefined1  [32])*coeffs);
  auVar1 = vpmaddubsw_avx2(auVar1,(undefined1  [32])*coeffs);
  auVar3._8_2_ = 0x22;
  auVar3._0_8_ = 0x22002200220022;
  auVar3._10_2_ = 0x22;
  auVar3._12_2_ = 0x22;
  auVar3._14_2_ = 0x22;
  auVar3._16_2_ = 0x22;
  auVar3._18_2_ = 0x22;
  auVar3._20_2_ = 0x22;
  auVar3._22_2_ = 0x22;
  auVar3._24_2_ = 0x22;
  auVar3._26_2_ = 0x22;
  auVar3._28_2_ = 0x22;
  auVar3._30_2_ = 0x22;
  auVar2 = vpaddw_avx2(auVar2,auVar3);
  auVar4 = vpsraw_avx2(auVar2,6);
  auVar2 = vpaddw_avx2(auVar1,auVar3);
  auVar2 = vpsraw_avx2(auVar2,6);
  auVar2 = vpackuswb_avx2(auVar4,auVar2);
  *(undefined1 (*) [32])dst = auVar2;
  return;
}

Assistant:

static inline void x_convolve_2tap_32_avx2(const uint8_t *const src,
                                           const __m256i coeffs[1],
                                           __m256i r[2]) {
  const __m256i s0 = _mm256_loadu_si256((__m256i *)src);
  const __m256i s1 = _mm256_loadu_si256((__m256i *)(src + 1));
  const __m256i ss0 = _mm256_unpacklo_epi8(s0, s1);
  const __m256i ss1 = _mm256_unpackhi_epi8(s0, s1);

  r[0] = convolve_2tap_avx2(&ss0, coeffs);
  r[1] = convolve_2tap_avx2(&ss1, coeffs);
}